

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlabel.cpp
# Opt level: O2

void __thiscall QLabelPrivate::~QLabelPrivate(QLabelPrivate *this)

{
  _Manager_type p_Var1;
  
  *(undefined ***)&(this->super_QFramePrivate).super_QWidgetPrivate = &PTR__QLabelPrivate_007cd978;
  p_Var1 = (this->resourceProvider).super__Function_base._M_manager;
  if (p_Var1 != (_Manager_type)0x0) {
    (*p_Var1)((_Any_data *)&this->resourceProvider,(_Any_data *)&this->resourceProvider,
              __destroy_functor);
  }
  QWeakPointer<QObject>::~QWeakPointer(&(this->buddy).wp);
  QCursor::~QCursor(&this->cursor);
  QTextCursor::~QTextCursor(&this->shortcutCursor);
  std::array<QMetaObject::Connection,_2UL>::~array(&this->movieConnections);
  QWeakPointer<QObject>::~QWeakPointer(&(this->movie).wp);
  std::_Optional_payload_base<QPicture>::_M_reset
            ((_Optional_payload_base<QPicture> *)&this->picture);
  std::_Optional_payload_base<QIcon>::_M_reset((_Optional_payload_base<QIcon> *)&this->icon);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&(this->text).d);
  QFramePrivate::~QFramePrivate(&this->super_QFramePrivate);
  return;
}

Assistant:

QLabelPrivate::~QLabelPrivate()
{
}